

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

void ScaleVector(cupdlp_float weight,cupdlp_float *x,cupdlp_int n)

{
  ulong uVar1;
  
  if (0 < n) {
    uVar1 = 0;
    do {
      x[uVar1] = x[uVar1] * weight;
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return;
}

Assistant:

void ScaleVector(cupdlp_float weight, cupdlp_float *x, cupdlp_int n) {
#ifdef USE_MY_BLAS

  for (int i = 0; i < n; ++i) {
    x[i] *= weight;
  }

#else
  return ddot(n, x, incx, y, incy);
#endif
}